

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_writers.h
# Opt level: O3

void date::number_writer<4>::
     write<std::ostreambuf_iterator<char,std::char_traits<char>>,unsigned_short>
               (ostreambuf_iterator<char,_std::char_traits<char>_> *dst,unsigned_short value)

{
  char __c;
  int iVar1;
  undefined6 in_register_00000032;
  
  iVar1 = (int)CONCAT62(in_register_00000032,value);
  if (iVar1 == 0) {
    iVar1 = 3;
    do {
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,'0');
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    __c = '0';
  }
  else {
    number_writer<3>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,int>
              (dst,value / 10);
    __c = "0123456789"[iVar1 + (value / 10) * -10 & 0xffff];
  }
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,__c);
  return;
}

Assistant:

static void write(Iterator& dst, Number value)
    {
        using char_type = typename iterator_traits<Iterator>::value_type;
        constexpr auto digits = number_writer<0>::digits<char_type>();
        if (value == 0)
        {
            for (int i = 0; i < Width - 1; ++i)
                *(dst++) = digits[0];
            *(dst++) = digits[0];
            return;
        }
        number_writer<Width - 1>::write(dst, value / 10);
        *(dst++) = digits[value % 10];
    }